

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

bool __thiscall TcpSocketImpl::GetConnectionInfo(TcpSocketImpl *this)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  allocator<char> local_1b5;
  socklen_t addLen;
  string caAddrPeer;
  string servInfoPeer;
  string servInfoClient;
  string caAddrClient;
  string local_130;
  sockaddr_storage addrPe;
  sockaddr_storage addrCl;
  
  addLen = 0x80;
  iVar1 = getpeername((this->super_BaseSocketImpl).m_fSock,(sockaddr *)&addrCl,&addLen);
  if (iVar1 == 0) {
    addLen = 0x80;
    iVar1 = getsockname((this->super_BaseSocketImpl).m_fSock,(sockaddr *)&addrPe,&addLen);
    if (iVar1 == 0) {
      caAddrClient._M_dataplus._M_p = (pointer)&caAddrClient.field_2;
      std::__cxx11::string::_M_construct((ulong)&caAddrClient,'/');
      servInfoClient._M_dataplus._M_p = (pointer)&servInfoClient.field_2;
      std::__cxx11::string::_M_construct((ulong)&servInfoClient,' ');
      iVar1 = getnameinfo((sockaddr *)&addrCl,0x80,caAddrClient._M_dataplus._M_p,0x2e,
                          servInfoClient._M_dataplus._M_p,0x20,3);
      if (iVar1 == 0) {
        std::__cxx11::string::assign((char *)&this->m_strClientAddr);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&caAddrPeer,servInfoClient._M_dataplus._M_p,
                   (allocator<char> *)&servInfoPeer);
        iVar1 = std::__cxx11::stoi(&caAddrPeer,(size_t *)0x0,10);
        this->m_sClientPort = (uint16_t)iVar1;
        std::__cxx11::string::~string((string *)&caAddrPeer);
        caAddrPeer._M_dataplus._M_p = (pointer)&caAddrPeer.field_2;
        std::__cxx11::string::_M_construct((ulong)&caAddrPeer,'/');
        servInfoPeer._M_dataplus._M_p = (pointer)&servInfoPeer.field_2;
        std::__cxx11::string::_M_construct((ulong)&servInfoPeer,' ');
        iVar1 = getnameinfo((sockaddr *)&addrPe,0x80,caAddrPeer._M_dataplus._M_p,0x2e,
                            servInfoPeer._M_dataplus._M_p,0x20,3);
        bVar3 = iVar1 == 0;
        if (bVar3) {
          std::__cxx11::string::assign((char *)&this->m_strIFaceAddr);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_130,servInfoPeer._M_dataplus._M_p,&local_1b5);
          iVar1 = std::__cxx11::stoi(&local_130,(size_t *)0x0,10);
          this->m_sIFacePort = (uint16_t)iVar1;
          std::__cxx11::string::~string((string *)&local_130);
        }
        else {
          piVar2 = __errno_location();
          (this->super_BaseSocketImpl).m_iError = *piVar2;
          (this->super_BaseSocketImpl).m_iErrLoc = 0xd;
        }
        std::__cxx11::string::~string((string *)&servInfoPeer);
        std::__cxx11::string::~string((string *)&caAddrPeer);
      }
      else {
        piVar2 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar2;
        (this->super_BaseSocketImpl).m_iErrLoc = 0xc;
        bVar3 = false;
      }
      std::__cxx11::string::~string((string *)&servInfoClient);
      std::__cxx11::string::~string((string *)&caAddrClient);
      return bVar3;
    }
    piVar2 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar2;
    (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
  }
  else {
    piVar2 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar2;
    (this->super_BaseSocketImpl).m_iErrLoc = 10;
  }
  return false;
}

Assistant:

bool TcpSocketImpl::GetConnectionInfo()
{
    struct sockaddr_storage addrCl;
    socklen_t addLen = sizeof(addrCl);
    if (::getpeername(m_fSock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen) != 0)  // Get the IP to where the connection was established
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 10;
        return false;
    }

    struct sockaddr_storage addrPe;
    addLen = sizeof(addrPe);
    if (::getsockname(m_fSock, reinterpret_cast<struct sockaddr*>(&addrPe), &addLen) != 0)  // Get our IP where the connection was established
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 11;
        return false;
    }

    string caAddrClient(INET6_ADDRSTRLEN + 1, 0);
    string servInfoClient(NI_MAXSERV, 0);
    if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrCl), sizeof(struct sockaddr_storage), &caAddrClient[0], INET6_ADDRSTRLEN, &servInfoClient[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
    {
        m_strClientAddr = &caAddrClient[0];
        m_sClientPort = static_cast<uint16_t>(stoi(&servInfoClient[0]));
    }
    else
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 12;
        return false;
    }

    string caAddrPeer(INET6_ADDRSTRLEN + 1, 0);
    string servInfoPeer(NI_MAXSERV, 0);
    if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addrPe), sizeof(struct sockaddr_storage), &caAddrPeer[0], INET6_ADDRSTRLEN, &servInfoPeer[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
    {
        m_strIFaceAddr = &caAddrPeer[0];
        m_sIFacePort = static_cast<uint16_t>(stoi(&servInfoPeer[0]));
    }
    else
    {
        m_iError = WSAGetLastError();
        m_iErrLoc = 13;
        return false;
    }

    return true;
}